

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

Am_Value compute_click_start_when_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *value;
  Am_Wrapper *initial;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Flags in_RSI;
  Am_Value AVar2;
  Am_Input_Char local_60;
  undefined4 local_5c;
  Am_Value local_58;
  Am_Input_Char local_48;
  Am_Input_Char local_44;
  undefined1 local_40 [4];
  Am_Input_Char parent_char;
  Am_Value_List char_list;
  Am_Object local_20;
  Am_Object widget;
  Am_Object *self_local;
  
  Am_Object::Get_Owner(&local_20,in_RSI);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    get_owner_start_and_convert_string((Am_Object *)local_40);
    Am_Input_Char::Am_Input_Char(&local_44,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
    Am_Value_List::Start((Am_Value_List *)local_40);
    while( true ) {
      bVar1 = Am_Value_List::Last((Am_Value_List *)local_40);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      value = Am_Value_List::Get((Am_Value_List *)local_40);
      Am_Input_Char::Am_Input_Char(&local_48,value);
      Am_Input_Char::operator=(&local_44,&local_48);
      local_44._2_2_ = local_44._2_2_ & 0xff0f | 0x40;
      Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_58);
      Am_Value_List::Set((Am_Value_List *)local_40,&local_58,true);
      Am_Value::~Am_Value(&local_58);
      Am_Value_List::Next((Am_Value_List *)local_40);
    }
    initial = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_40);
    Am_Value::Am_Value((Am_Value *)self,initial);
    local_5c = 1;
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_40);
  }
  else {
    Am_Input_Char::Am_Input_Char(&local_60,"LEFT_CLICK",true);
    Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)self);
    local_5c = 1;
  }
  Am_Object::~Am_Object(&local_20);
  AVar2.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar2._0_8_ = self;
  return AVar2;
}

Assistant:

Am_Define_Formula(Am_Value, compute_click_start_when)
{
  Am_Object widget = self.Get_Owner();
  if (widget.Valid()) {
    Am_Value_List char_list = get_owner_start_and_convert_string(widget);
    Am_Input_Char parent_char;
    for (char_list.Start(); !char_list.Last(); char_list.Next()) {
      parent_char = (Am_Input_Char)char_list.Get();
      parent_char.button_down = Am_BUTTON_CLICK;
      char_list.Set(parent_char);
    }
    return Am_Value(char_list);
  } else
    return Am_Input_Char("LEFT_CLICK");
}